

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,int du_stride,float *fdtbl,
              int DC,unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  sbyte sVar6;
  undefined1 auVar7 [32];
  int iVar8;
  uint uVar9;
  float fVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  unsigned_short *bs;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  float *pfVar27;
  uint uVar28;
  int iVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float in_XMM3_Da;
  float in_XMM3_Db;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  float in_YMM3_H;
  float in_register_000012d4;
  float in_register_000012d8;
  float in_register_000012dc;
  int DU [64];
  
  uVar2 = (*HTAC)[0];
  uVar3 = HTAC[0xf0][0];
  if (du_stride == 0) {
    lVar23 = 0;
  }
  else {
    lVar23 = (long)du_stride;
    pfVar27 = CDU + 7;
    lVar25 = 0;
    do {
      stbiw__jpg_DCT(pfVar27 + -7,pfVar27 + -6,pfVar27 + -5,pfVar27 + -4,pfVar27 + -3,pfVar27 + -2,
                     pfVar27 + -1,pfVar27);
      lVar25 = lVar25 + lVar23;
      pfVar27 = pfVar27 + lVar23;
    } while (lVar25 < (long)(ulong)(uint)(du_stride * 8));
  }
  lVar25 = 0;
  do {
    stbiw__jpg_DCT((float *)((long)CDU + lVar25),(float *)((long)CDU + lVar25 + lVar23 * 4),
                   (float *)((long)CDU + lVar25 + (ulong)(uint)(du_stride * 2) * 4),
                   (float *)((long)CDU + lVar25 + (long)(du_stride * 3) * 4),
                   (float *)((long)CDU + lVar25 + (ulong)(uint)(du_stride * 4) * 4),
                   (float *)((long)CDU + lVar25 + (long)(du_stride * 5) * 4),
                   (float *)((long)CDU + lVar25 + (long)(du_stride * 6) * 4),
                   (float *)((long)CDU + lVar25 + (long)(du_stride * 7) * 4));
    lVar25 = lVar25 + 4;
  } while (lVar25 != 0x20);
  auVar31._8_4_ = 0x3f000000;
  auVar31._0_8_ = 0x3f0000003f000000;
  auVar31._12_4_ = 0x3f000000;
  auVar31._16_4_ = 0x3f000000;
  auVar31._20_4_ = 0x3f000000;
  auVar31._24_4_ = 0x3f000000;
  auVar31._28_4_ = 0x3f000000;
  lVar20 = 8;
  lVar25 = 0;
  do {
    lVar24 = (long)(int)lVar25;
    fVar10 = *CDU;
    pfVar11 = CDU + 1;
    pfVar12 = CDU + 2;
    pfVar13 = CDU + 3;
    pfVar14 = CDU + 4;
    pfVar15 = CDU + 5;
    pfVar16 = CDU + 6;
    pfVar17 = CDU + 7;
    CDU = CDU + lVar23;
    lVar20 = lVar20 + -1;
    pfVar27 = fdtbl + lVar24;
    auVar7._4_4_ = *pfVar11 * pfVar27[1];
    auVar7._0_4_ = fVar10 * *pfVar27;
    auVar7._8_4_ = *pfVar12 * pfVar27[2];
    auVar7._12_4_ = *pfVar13 * pfVar27[3];
    auVar7._16_4_ = *pfVar14 * pfVar27[4];
    auVar7._20_4_ = *pfVar15 * pfVar27[5];
    auVar7._24_4_ = *pfVar16 * pfVar27[6];
    auVar7._28_4_ = *pfVar17;
    lVar25 = lVar24 + 8;
    uVar21 = vcmpps_avx512vl(auVar7,ZEXT1632(ZEXT816(0) << 0x40),1);
    auVar30._8_4_ = 0xbf000000;
    auVar30._0_8_ = 0xbf000000bf000000;
    auVar30._12_4_ = 0xbf000000;
    auVar30._16_4_ = 0xbf000000;
    auVar30._20_4_ = 0xbf000000;
    auVar30._24_4_ = 0xbf000000;
    auVar30._28_4_ = 0xbf000000;
    auVar30 = vblendmps_avx512vl(auVar31,auVar30);
    bVar5 = (bool)((byte)uVar21 & 1);
    in_XMM3_Da = (float)((uint)bVar5 * auVar30._0_4_ | (uint)!bVar5 * (int)in_XMM3_Da);
    bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
    in_XMM3_Db = (float)((uint)bVar5 * auVar30._4_4_ | (uint)!bVar5 * (int)in_XMM3_Db);
    bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
    in_XMM3_Dc = (float)((uint)bVar5 * auVar30._8_4_ | (uint)!bVar5 * (int)in_XMM3_Dc);
    bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
    in_XMM3_Dd = (float)((uint)bVar5 * auVar30._12_4_ | (uint)!bVar5 * (int)in_XMM3_Dd);
    bVar5 = (bool)((byte)(uVar21 >> 4) & 1);
    in_YMM3_H = (float)((uint)bVar5 * auVar30._16_4_ | (uint)!bVar5 * (int)in_YMM3_H);
    bVar5 = (bool)((byte)(uVar21 >> 5) & 1);
    in_register_000012d4 =
         (float)((uint)bVar5 * auVar30._20_4_ | (uint)!bVar5 * (int)in_register_000012d4);
    bVar5 = (bool)((byte)(uVar21 >> 6) & 1);
    in_register_000012d8 =
         (float)((uint)bVar5 * auVar30._24_4_ | (uint)!bVar5 * (int)in_register_000012d8);
    bVar5 = SUB81(uVar21 >> 7,0);
    in_register_000012dc =
         (float)((uint)bVar5 * auVar30._28_4_ | (uint)!bVar5 * (int)in_register_000012dc);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)("" + lVar24);
    auVar30 = vpmovzxbd_avx2(auVar1);
    auVar32._0_4_ = (int)(fVar10 * *pfVar27 + in_XMM3_Da);
    auVar32._4_4_ = (int)(*pfVar11 * pfVar27[1] + in_XMM3_Db);
    auVar32._8_4_ = (int)(*pfVar12 * pfVar27[2] + in_XMM3_Dc);
    auVar32._12_4_ = (int)(*pfVar13 * pfVar27[3] + in_XMM3_Dd);
    auVar32._16_4_ = (int)(*pfVar14 * pfVar27[4] + in_YMM3_H);
    auVar32._20_4_ = (int)(*pfVar15 * pfVar27[5] + in_register_000012d4);
    auVar32._24_4_ = (int)(*pfVar16 * pfVar27[6] + in_register_000012d8);
    auVar32._28_4_ = (int)(*pfVar17 + in_register_000012dc);
    vpscatterdd_avx512vl(ZEXT832(DU) + auVar30 * (undefined1  [32])0x4,0xffff,auVar32);
  } while (lVar20 != 0);
  uVar18 = DU[0] - DC;
  if (uVar18 == 0) {
    bs = (unsigned_short *)(ulong)(*HTDC)[0];
  }
  else {
    uVar19 = -uVar18;
    if (0 < (int)uVar18) {
      uVar19 = uVar18;
    }
    uVar26 = 1;
    if (1 < uVar19) {
      uVar26 = 0x20 - LZCOUNT(uVar19);
    }
    sVar6 = ((byte)uVar26 < 0x21) * (' ' - (byte)uVar26);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)HTDC[uVar26 & 0xff][0]);
    bs = (unsigned_short *)(ulong)((((int)uVar18 >> 0x1f) + uVar18 << sVar6) >> sVar6);
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,bs);
  uVar21 = 0x40;
  while( true ) {
    iVar8 = (int)uVar21;
    uVar18 = iVar8 - 1;
    uVar21 = (ulong)uVar18;
    if (DU[uVar21] != 0) break;
    if (uVar18 < 2) goto LAB_0028fe2d;
  }
  if ((int)uVar18 < 1) goto LAB_0028fe2d;
  iVar22 = 1;
  do {
    lVar23 = (long)iVar22;
    uVar26 = 0xffffffff;
    uVar19 = 0;
    do {
      uVar28 = uVar19;
      uVar4 = DU[lVar23];
      uVar26 = uVar26 + 1;
      if ((long)uVar21 < lVar23) break;
      lVar23 = lVar23 + 1;
      uVar19 = uVar28 + 1;
    } while (uVar4 == 0);
    uVar19 = uVar26;
    if (0xf < (int)uVar26) {
      uVar28 = uVar28 >> 4;
      iVar29 = uVar28 + (uVar28 == 0);
      do {
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)uVar3);
        iVar29 = iVar29 + -1;
      } while (iVar29 != 0);
      uVar19 = uVar26 & 0xf;
    }
    iVar29 = iVar22 + uVar26;
    uVar28 = -uVar4;
    if (0 < (int)uVar4) {
      uVar28 = uVar4;
    }
    uVar9 = 0x20 - LZCOUNT(uVar28);
    if (uVar28 < 2) {
      uVar9 = 1;
    }
    sVar6 = ((byte)uVar9 < 0x21) * (' ' - (byte)uVar9);
    stbiw__jpg_writeBits
              (s,bitBuf,bitCnt,
               (unsigned_short *)(ulong)HTAC[(int)(uVar19 * 0x10 + (uVar9 & 0xff))][0]);
    stbiw__jpg_writeBits
              (s,bitBuf,bitCnt,
               (unsigned_short *)(ulong)((((int)uVar4 >> 0x1f) + uVar4 << sVar6) >> sVar6));
    iVar22 = iVar22 + 1 + uVar26;
  } while (iVar29 < (int)uVar18);
  if (iVar8 != 0x40) {
LAB_0028fe2d:
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)(ulong)uVar2);
  }
  return DU[0];
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, int du_stride, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, j, n, diff, end0pos, x, y;
   int DU[64];

   // DCT rows
   for(dataOff=0, n=du_stride*8; dataOff<n; dataOff+=du_stride) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+du_stride], &CDU[dataOff+du_stride*2], &CDU[dataOff+du_stride*3], &CDU[dataOff+du_stride*4],
                     &CDU[dataOff+du_stride*5], &CDU[dataOff+du_stride*6], &CDU[dataOff+du_stride*7]);
   }
   // Quantize/descale/zigzag the coefficients
   for(y = 0, j=0; y < 8; ++y) {
      for(x = 0; x < 8; ++x,++j) {
         float v;
         i = y*du_stride+x;
         v = CDU[i]*fdtbl[j];
         // DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
         // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
         DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
      }
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}